

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestUnpackedExtensions::~TestUnpackedExtensions(TestUnpackedExtensions *this)

{
  TestUnpackedExtensions *this_local;
  
  SharedDtor((MessageLite *)this);
  google::protobuf::Message::~Message(&this->super_Message);
  return;
}

Assistant:

TestUnpackedExtensions::~TestUnpackedExtensions() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestUnpackedExtensions)
  SharedDtor(*this);
}